

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          string_view text,SourceLocation includedFrom)

{
  atomic<unsigned_int> *paVar1;
  uint __val;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view pathStr;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  sVar2 = path._M_len;
  _Var3._M_p = path._M_str;
  if (path._M_len == 0) {
    s_abi_cxx11_(&local_70,"<unnamed_buffer",0xf);
    LOCK();
    paVar1 = &this->unnamedBufferCount;
    __val = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_d0,&local_70,&local_90);
    s_abi_cxx11_(&local_b0,">",1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                   &local_d0,&local_b0);
    std::__cxx11::string::operator=((string *)&temp,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    sVar2 = temp._M_string_length;
    _Var3 = temp._M_dataplus;
  }
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,std::allocator<char>>::insert<char_const*,void>
            ((vector<char,std::allocator<char>> *)&buffer,(const_iterator)0x0,text._M_str,
             text._M_str + text._M_len);
  if ((buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish) ||
     (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != '\0')) {
    local_d0._M_dataplus._M_p._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&buffer,(char *)&local_d0);
  }
  pathStr._M_str = _Var3._M_p;
  pathStr._M_len = sVar2;
  assignBuffer(__return_storage_ptr__,this,pathStr,&buffer,includedFrom);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::assignText(string_view path, string_view text,
                                       SourceLocation includedFrom) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    std::vector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom);
}